

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAllocPtr alloc)

{
  uint uVar1;
  CLzmaProb *pCVar2;
  UInt32 numProbs;
  ISzAllocPtr alloc_local;
  CLzmaProps *propNew_local;
  CLzmaDec *p_local;
  
  uVar1 = (0x300 << (propNew->lc + propNew->lp & 0x1f)) + 0x7c0;
  if ((p->probs == (CLzmaProb *)0x0) || (uVar1 != p->numProbs)) {
    LzmaDec_FreeProbs(p,alloc);
    pCVar2 = (CLzmaProb *)(*alloc->Alloc)(alloc,(ulong)uVar1 << 1);
    p->probs = pCVar2;
    if (p->probs == (CLzmaProb *)0x0) {
      return 2;
    }
    p->probs_1664 = p->probs + 0x680;
    p->numProbs = uVar1;
  }
  return 0;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec *p, const CLzmaProps *propNew, ISzAllocPtr alloc)
{
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (!p->probs || numProbs != p->numProbs)
  {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb *)ISzAlloc_Alloc(alloc, numProbs * sizeof(CLzmaProb));
    if (!p->probs)
      return SZ_ERROR_MEM;
    p->probs_1664 = p->probs + 1664;
    p->numProbs = numProbs;
  }
  return SZ_OK;
}